

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterResult __thiscall duckdb::FilterCombiner::AddFilter(FilterCombiner *this,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  ExpressionClass EVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FilterResult FVar6;
  BoundBetweenExpression *pBVar7;
  pointer pEVar8;
  type expr_00;
  Expression *expr_01;
  iterator iVar9;
  type pBVar10;
  FilterCombiner *pFVar11;
  Value *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_02;
  ExpressionType type;
  byte local_1b9;
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> local_1b8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_1b0;
  Value result;
  Value constant_value;
  idx_t equivalence_set;
  LogicalType local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  undefined1 local_c0 [72];
  
  iVar4 = (*(expr->super_BaseExpression)._vptr_BaseExpression[6])(expr);
  if ((char)iVar4 != '\0') {
    return UNSUPPORTED;
  }
  iVar4 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar4 == '\0') {
    EVar1 = (expr->super_BaseExpression).expression_class;
    if (EVar1 == BOUND_COMPARISON) {
      FVar6 = AddBoundComparisonFilter(this,expr);
      return FVar6;
    }
    if (EVar1 != BOUND_BETWEEN) {
      return UNSUPPORTED;
    }
    pBVar7 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(&expr->super_BaseExpression);
    this_00 = &pBVar7->lower;
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar4 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar8);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar7->upper);
    iVar5 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar8);
    local_1b9 = (byte)iVar5;
    if ((byte)((byte)iVar4 | local_1b9) != 1) {
      return UNSUPPORTED;
    }
    this_02 = &pBVar7->input;
    local_1b0 = &pBVar7->upper;
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(this_02);
    expr_01 = GetNode(this,expr_00);
    equivalence_set = GetEquivalenceSet(this,expr_01);
    if ((byte)iVar4 == 0) {
      type = pBVar7->upper_inclusive * '\x02' + COMPARE_LESSTHAN;
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&result,pEVar8);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_02);
      (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&constant_value,pEVar8);
      make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&local_1b8,&type,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &result,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&constant_value);
      pBVar10 = unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                ::operator*((unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                             *)&local_1b8);
      FVar6 = AddBoundComparisonFilter(this,&pBVar10->super_Expression);
      if (local_1b8._M_head_impl != (BoundComparisonExpression *)0x0) {
        (*((local_1b8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      if (constant_value.type_._0_8_ != 0) {
        (**(code **)(*(long *)constant_value.type_._0_8_ + 8))();
      }
      if (result.type_._0_8_ != 0) {
        (**(code **)(*(long *)result.type_._0_8_ + 8))();
      }
    }
    else {
      _Var2._M_head_impl =
           (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      LogicalType::LogicalType(&local_f0,SQLNULL);
      Value::Value(&constant_value,&local_f0);
      LogicalType::~LogicalType(&local_f0);
      bVar3 = ExpressionExecutor::TryEvaluateScalar
                        (this->context,_Var2._M_head_impl,&constant_value);
      FVar6 = UNSATISFIABLE;
      if (bVar3) {
        ExpressionValueInformation::ExpressionValueInformation
                  ((ExpressionValueInformation *)&result);
        Value::operator=(&result,&constant_value);
        iVar9 = ::std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
                ::find(&(this->constant_values)._M_t,&equivalence_set);
        pFVar11 = (FilterCombiner *)&stack0xffffffffffffff88;
        ExpressionValueInformation::ExpressionValueInformation
                  ((ExpressionValueInformation *)pFVar11,(ExpressionValueInformation *)&result);
        FVar6 = AddConstantComparison
                          (pFVar11,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                    *)&iVar9._M_node[1]._M_parent,
                           (ExpressionValueInformation *)&stack0xffffffffffffff88);
        Value::~Value((Value *)&stack0xffffffffffffff88);
        Value::~Value(&result);
      }
      Value::~Value(&constant_value);
      if (!bVar3) {
        return UNSUPPORTED;
      }
    }
    if (FVar6 != SUCCESS) {
      return FVar6;
    }
    if (local_1b9 == 0) {
      type = pBVar7->upper_inclusive * '\x02' + COMPARE_LESSTHAN;
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_02);
      (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&result,pEVar8);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(local_1b0);
      (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&constant_value,pEVar8);
      make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&local_1b8,&type,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &result,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&constant_value);
      pBVar10 = unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                ::operator*((unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                             *)&local_1b8);
      FVar6 = AddBoundComparisonFilter(this,&pBVar10->super_Expression);
      if (local_1b8._M_head_impl != (BoundComparisonExpression *)0x0) {
        (*((local_1b8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      if (constant_value.type_._0_8_ != 0) {
        (**(code **)(*(long *)constant_value.type_._0_8_ + 8))();
      }
      if (result.type_._0_8_ == 0) {
        return FVar6;
      }
      (**(code **)(*(long *)result.type_._0_8_ + 8))();
      return FVar6;
    }
    _Var2._M_head_impl =
         (local_1b0->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    LogicalType::LogicalType(&local_108,SQLNULL);
    Value::Value(&constant_value,&local_108);
    LogicalType::~LogicalType(&local_108);
    bVar3 = ExpressionExecutor::TryEvaluateScalar(this->context,_Var2._M_head_impl,&constant_value);
    if (bVar3) {
      ExpressionValueInformation::ExpressionValueInformation((ExpressionValueInformation *)&result);
      Value::operator=(&result,&constant_value);
      iVar9 = ::std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
              ::find(&(this->constant_values)._M_t,&equivalence_set);
      pFVar11 = (FilterCombiner *)local_c0;
      ExpressionValueInformation::ExpressionValueInformation
                ((ExpressionValueInformation *)pFVar11,(ExpressionValueInformation *)&result);
      FVar6 = AddConstantComparison
                        (pFVar11,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *
                                 )&iVar9._M_node[1]._M_parent,(ExpressionValueInformation *)local_c0
                        );
      Value::~Value((Value *)local_c0);
      Value::~Value(&result);
    }
    else {
      FVar6 = UNSUPPORTED;
    }
    this_01 = &constant_value;
  }
  else {
    LogicalType::LogicalType(&local_d8,SQLNULL);
    Value::Value(&result,&local_d8);
    LogicalType::~LogicalType(&local_d8);
    bVar3 = ExpressionExecutor::TryEvaluateScalar(this->context,expr,&result);
    if (bVar3) {
      LogicalType::LogicalType((LogicalType *)&equivalence_set,BOOLEAN);
      FVar6 = UNSATISFIABLE;
      Value::DefaultCastAs(&constant_value,&result,(LogicalType *)&equivalence_set,false);
      Value::operator=(&result,&constant_value);
      Value::~Value(&constant_value);
      LogicalType::~LogicalType((LogicalType *)&equivalence_set);
      if (result.is_null == false) {
        bVar3 = BooleanValue::Get(&result);
        FVar6 = (FilterResult)bVar3;
      }
    }
    else {
      FVar6 = UNSUPPORTED;
    }
    this_01 = &result;
  }
  Value::~Value(this_01);
  return FVar6;
}

Assistant:

FilterResult FilterCombiner::AddFilter(Expression &expr) {
	if (expr.HasParameter()) {
		return FilterResult::UNSUPPORTED;
	}
	if (expr.IsFoldable()) {
		// scalar condition, evaluate it
		Value result;
		if (!ExpressionExecutor::TryEvaluateScalar(context, expr, result)) {
			return FilterResult::UNSUPPORTED;
		}
		result = result.DefaultCastAs(LogicalType::BOOLEAN);
		// check if the filter passes
		if (result.IsNull() || !BooleanValue::Get(result)) {
			// the filter does not pass the scalar test, create an empty result
			return FilterResult::UNSATISFIABLE;
		} else {
			// the filter passes the scalar test, just remove the condition
			return FilterResult::SUCCESS;
		}
	}
	D_ASSERT(!expr.IsFoldable());
	if (expr.GetExpressionClass() == ExpressionClass::BOUND_BETWEEN) {
		auto &comparison = expr.Cast<BoundBetweenExpression>();
		//! check if one of the sides is a scalar value
		bool lower_is_scalar = comparison.lower->IsFoldable();
		bool upper_is_scalar = comparison.upper->IsFoldable();
		if (lower_is_scalar || upper_is_scalar) {
			//! comparison with scalar - break apart
			auto &node = GetNode(*comparison.input);
			idx_t equivalence_set = GetEquivalenceSet(node);
			auto result = FilterResult::UNSATISFIABLE;

			if (lower_is_scalar) {
				auto scalar = comparison.lower.get();
				Value constant_value;
				if (!ExpressionExecutor::TryEvaluateScalar(context, *scalar, constant_value)) {
					return FilterResult::UNSUPPORTED;
				}

				// create the ExpressionValueInformation
				ExpressionValueInformation info;
				if (comparison.lower_inclusive) {
					info.comparison_type = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
				} else {
					info.comparison_type = ExpressionType::COMPARE_GREATERTHAN;
				}
				info.constant = constant_value;

				// get the current bucket of constant values
				D_ASSERT(constant_values.find(equivalence_set) != constant_values.end());
				auto &info_list = constant_values.find(equivalence_set)->second;
				// check the existing constant comparisons to see if we can do any pruning
				result = AddConstantComparison(info_list, info);
			} else {
				D_ASSERT(upper_is_scalar);
				const auto type = comparison.upper_inclusive ? ExpressionType::COMPARE_LESSTHANOREQUALTO
				                                             : ExpressionType::COMPARE_LESSTHAN;
				auto left = comparison.lower->Copy();
				auto right = comparison.input->Copy();
				auto lower_comp = make_uniq<BoundComparisonExpression>(type, std::move(left), std::move(right));
				result = AddBoundComparisonFilter(*lower_comp);
			}

			//	 Stop if we failed
			if (result != FilterResult::SUCCESS) {
				return result;
			}

			if (upper_is_scalar) {
				auto scalar = comparison.upper.get();
				Value constant_value;
				if (!ExpressionExecutor::TryEvaluateScalar(context, *scalar, constant_value)) {
					return FilterResult::UNSUPPORTED;
				}

				// create the ExpressionValueInformation
				ExpressionValueInformation info;
				if (comparison.upper_inclusive) {
					info.comparison_type = ExpressionType::COMPARE_LESSTHANOREQUALTO;
				} else {
					info.comparison_type = ExpressionType::COMPARE_LESSTHAN;
				}
				info.constant = constant_value;

				// get the current bucket of constant values
				D_ASSERT(constant_values.find(equivalence_set) != constant_values.end());
				// check the existing constant comparisons to see if we can do any pruning
				result = AddConstantComparison(constant_values.find(equivalence_set)->second, info);
			} else {
				D_ASSERT(lower_is_scalar);
				const auto type = comparison.upper_inclusive ? ExpressionType::COMPARE_LESSTHANOREQUALTO
				                                             : ExpressionType::COMPARE_LESSTHAN;
				auto left = comparison.input->Copy();
				auto right = comparison.upper->Copy();
				auto upper_comp = make_uniq<BoundComparisonExpression>(type, std::move(left), std::move(right));
				result = AddBoundComparisonFilter(*upper_comp);
			}

			return result;
		}
	} else if (expr.GetExpressionClass() == ExpressionClass::BOUND_COMPARISON) {
		return AddBoundComparisonFilter(expr);
	}
	// only comparisons supported for now
	return FilterResult::UNSUPPORTED;
}